

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

int __thiscall kws::Parser::IsInClass(Parser *this,size_t position)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong in_RSI;
  string *in_RDI;
  bool bVar5;
  size_t unaff_retaddr;
  Parser *in_stack_00000008;
  size_t classEnd;
  size_t i;
  size_t classPos;
  int inClass;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  size_t local_68;
  ulong local_60;
  string *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  size_t in_stack_ffffffffffffffb8;
  string local_40 [6];
  char in_stack_ffffffffffffffc6;
  char in_stack_ffffffffffffffc7;
  Parser *in_stack_ffffffffffffffc8;
  ulong local_20;
  int local_14;
  string *buffer;
  
  local_14 = 0;
  buffer = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",(allocator *)&stack0xffffffffffffffbf);
  local_20 = GetClassPosition(in_stack_00000008,unaff_retaddr,buffer);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  while (local_20 != 0xffffffffffffffff) {
    local_60 = local_20;
    while( true ) {
      uVar1 = local_60;
      bVar5 = false;
      if (local_60 != 0xffffffffffffffff) {
        uVar2 = std::__cxx11::string::size();
        bVar5 = uVar1 < uVar2;
      }
      if ((!bVar5) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]
                                     ((ulong)((long)&in_RDI[0x28].field_2 + 8)), *pcVar3 == '{'))
      break;
      local_60 = local_60 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    sVar4 = FindClosingChar(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7,
                            in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8,
                            (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if ((local_20 < in_RSI) && (in_RSI < sVar4)) {
      local_14 = local_14 + 1;
    }
    local_68 = sVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",&local_b1);
    local_20 = GetClassPosition(in_stack_00000008,unaff_retaddr,buffer);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  return local_14;
}

Assistant:

int Parser::IsInClass(size_t position) const
{
  int inClass = 0;
  size_t classPos = this->GetClassPosition(0);
  while(classPos!=std::string::npos)
    {
    size_t i=classPos;
    while(i!=std::string::npos && i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == '{')
        {
        break;
        }
      i++;
      }
    size_t classEnd = this->FindClosingChar('{','}',i+1,true);

    if(position>classPos && position<classEnd)
      {
      inClass++;
      }
    classPos = this->GetClassPosition(classPos+1);
    }

  return inClass;
}